

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

CATNNode<unsigned_char> *
std::__uninitialized_copy<false>::
__uninit_copy<Centaurus::CATNNode<unsigned_char>const*,Centaurus::CATNNode<unsigned_char>*>
          (CATNNode<unsigned_char> *__first,CATNNode<unsigned_char> *__last,
          CATNNode<unsigned_char> *__result)

{
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *this;
  wstring *pwVar1;
  CATNNode<unsigned_char> *pCVar2;
  long lVar3;
  long lVar4;
  
  if (__first != __last) {
    lVar3 = 0;
    do {
      lVar4 = lVar3;
      this = (vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
              *)((long)&(__result->m_transitions).
                        super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar4);
      this[-1].
      super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__CATNNode_001c9f40;
      vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ::vector(this,(vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                     *)((long)&(__first->m_transitions).
                               super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4));
      pwVar1 = (wstring *)((long)&(__result->m_submachine).m_id._M_dataplus._M_p + lVar4);
      lVar3 = (long)&(__result->m_submachine).m_id.field_2 + lVar4;
      *(undefined ***)(pwVar1 + -8) = &PTR__Identifier_001c8d10;
      *(long *)(lVar3 + -0x10) = lVar3;
      lVar3 = *(long *)((long)&(__first->m_submachine).m_id._M_dataplus._M_p + lVar4);
      __cxx11::wstring::_M_construct<wchar_t*>
                (pwVar1,lVar3,
                 lVar3 + *(long *)((long)&(__first->m_submachine).m_id._M_string_length + lVar4) * 4
                );
      pCVar2 = (CATNNode<unsigned_char> *)((long)&__first[1]._vptr_CATNNode + lVar4);
      *(int *)((long)&__result->m_source + lVar4) = pCVar2[-1].m_source;
      lVar3 = lVar4 + 0x50;
    } while (pCVar2 != __last);
    __result = (CATNNode<unsigned_char> *)((long)&__result[1]._vptr_CATNNode + lVar4);
  }
  return __result;
}

Assistant:

CharClass(wchar_t start, wchar_t end)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(start, end));
    }